

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O1

void __thiscall
google::protobuf::internal::ArenaStringPtr::Set(ArenaStringPtr *this,string_view value,Arena *arena)

{
  void *pvVar1;
  string *psVar2;
  string *unaff_RBX;
  TaggedStringPtr TVar3;
  ulong uVar4;
  ArenaStringPtr *pAVar5;
  string_view s;
  ArenaStringPtr aAStack_38 [2];
  
  s._M_len = value._M_str;
  pAVar5 = aAStack_38;
  pvVar1 = (this->tagged_ptr_).ptr_;
  if (((ulong)pvVar1 & 3) == 0) {
    if (arena != (Arena *)0x0) {
      s._M_str = (char *)arena;
      TVar3 = anon_unknown_7::CreateArenaString((anon_unknown_7 *)arena,(Arena *)value._M_len,s);
      goto LAB_001c5fd1;
    }
    unaff_RBX = (string *)operator_new(0x20);
    *(string **)unaff_RBX = unaff_RBX + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              (unaff_RBX,s._M_len,s._M_len + (long)&((Arena *)value._M_len)->impl_);
    pAVar5 = (ArenaStringPtr *)((ulong)unaff_RBX & 3);
    if (pAVar5 != (ArenaStringPtr *)0x0) goto LAB_001c5ff2;
    psVar2 = (string *)0x0;
  }
  else {
    if (((ulong)pvVar1 & 2) == 0) {
      Set(aAStack_38);
    }
    else {
      uVar4 = (ulong)pvVar1 & 0xfffffffffffffffc;
      if (uVar4 != 0) {
        std::__cxx11::string::_M_replace(uVar4,0,*(char **)(uVar4 + 8),(ulong)s._M_len);
        return;
      }
    }
    Set(aAStack_38);
LAB_001c5ff2:
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<unsigned_long,unsigned_long>
                       ((ulong)pAVar5,0,"reinterpret_cast<uintptr_t>(p) & kMask == 0UL");
  }
  if (psVar2 != (string *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)aAStack_38,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/arenastring.h"
               ,0xbe,*(undefined8 *)(psVar2 + 8),*(undefined8 *)psVar2);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)aAStack_38);
  }
  TVar3.ptr_ = (void *)((ulong)unaff_RBX | 2);
LAB_001c5fd1:
  (this->tagged_ptr_).ptr_ = TVar3.ptr_;
  return;
}

Assistant:

void ArenaStringPtr::Set(absl::string_view value, Arena* arena) {
  ScopedCheckPtrInvariants check(&tagged_ptr_);
  if (IsDefault()) {
    // If we're not on an arena, skip straight to a true string to avoid
    // possible copy cost later.
    tagged_ptr_ = arena != nullptr ? CreateArenaString(*arena, value)
                                   : CreateString(value);
  } else {
    if (internal::DebugHardenForceCopyDefaultString()) {
      if (arena == nullptr) {
        auto* old = tagged_ptr_.GetIfAllocated();
        tagged_ptr_ = CreateString(value);
        delete old;
      } else {
        auto* old = UnsafeMutablePointer();
        tagged_ptr_ = CreateArenaString(*arena, value);
        old->assign("garbagedata");
      }
    } else {
      UnsafeMutablePointer()->assign(value.data(), value.length());
    }
  }
}